

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerCPP::variable_decl
          (string *__return_storage_ptr__,CompilerCPP *this,SPIRType *type,string *name,
          uint32_t param_3)

{
  bool bVar1;
  char *__rhs;
  undefined4 in_register_00000084;
  bool bVar2;
  uint index;
  ulong uVar3;
  string base;
  string local_70;
  string local_50;
  
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
            (&base,this,type,0,CONCAT44(in_register_00000084,param_3));
  Compiler::remap_variable_type_name((Compiler *)this,type,name,&base);
  bVar2 = false;
  for (index = 0; uVar3 = (ulong)index,
      uVar3 < (type->array).super_VectorView<unsigned_int>.buffer_size; index = index + 1) {
    if (((type->array).super_VectorView<unsigned_int>.ptr[uVar3] != 0) ||
       (bVar1 = true, (type->array_size_literal).super_VectorView<bool>.ptr[uVar3] == false)) {
      CompilerGLSL::to_array_size_abi_cxx11_(&local_50,&this->super_CompilerGLSL,type,index);
      join<char_const(&)[12],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
                (&local_70,(spirv_cross *)"std::array<",(char (*) [12])&base,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x341bb2,
                 (char (*) [3])&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x342c7f,
                 (char (*) [2])__return_storage_ptr__);
      ::std::__cxx11::string::operator=((string *)&base,(string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_50);
      bVar1 = bVar2;
    }
    bVar2 = bVar1;
  }
  ::std::__cxx11::string::push_back((char)&base);
  ::std::operator+(&local_70,&base,name);
  __rhs = "";
  if (bVar2) {
    __rhs = "[1]";
  }
  ::std::operator+(__return_storage_ptr__,&local_70,__rhs);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&base);
  return __return_storage_ptr__;
}

Assistant:

string CompilerCPP::variable_decl(const SPIRType &type, const string &name, uint32_t /* id */)
{
	string base = type_to_glsl(type);
	remap_variable_type_name(type, name, base);
	bool runtime = false;

	for (uint32_t i = 0; i < type.array.size(); i++)
	{
		auto &array = type.array[i];
		if (!array && type.array_size_literal[i])
		{
			// Avoid using runtime arrays with std::array since this is undefined.
			// Runtime arrays cannot be passed around as values, so this is fine.
			runtime = true;
		}
		else
			base = join("std::array<", base, ", ", to_array_size(type, i), ">");
	}
	base += ' ';
	return base + name + (runtime ? "[1]" : "");
}